

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

void __thiscall
EnvironmentNAVXYTHETALATTICE::PrecomputeActionswithBaseMotionPrimitive
          (EnvironmentNAVXYTHETALATTICE *this,
          vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
          *motionprimitiveV)

{
  pointer psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 uVar12;
  ulong uVar13;
  pointer psVar14;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *poses;
  ulong *puVar15;
  size_type sVar16;
  size_type *psVar17;
  reference pvVar18;
  reference pvVar19;
  reference pvVar20;
  pointer psVar21;
  sbpl_2Dcell_t sVar22;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *in_RSI;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_RDI;
  ulong uVar23;
  int targettheta;
  double roty;
  double rotx;
  sbpl_xy_theta_pt_t intermpt;
  int pind;
  sbpl_xy_theta_cell_t previnterm3Dcell;
  int endy_c;
  int endx_c;
  double endy;
  double endx;
  double mp_endtheta_rad;
  double mp_endy_m;
  double mp_endx_m;
  size_t aind;
  sbpl_xy_theta_pt_t sourcepose;
  int tind;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> footprint;
  value_type *in_stack_fffffffffffffd78;
  EnvNAVXYTHETALATAction_t *in_stack_fffffffffffffd80;
  value_type *__x;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_stack_fffffffffffffd90;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *in_stack_fffffffffffffdd0;
  int local_210;
  int local_20c;
  sbpl_2Dcell_t local_160;
  pointer in_stack_fffffffffffffed8;
  int local_a0;
  sbpl_xy_theta_cell_t local_9c;
  int local_90;
  int local_8c;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  ulong local_60;
  sbpl_xy_theta_pt_t local_58;
  int local_2c;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *local_10;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*(int *)&in_RDI[2].
                                super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                _M_impl.super__Vector_impl_data._M_start;
  uVar13 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  local_10 = in_RSI;
  psVar14 = (pointer)operator_new__(uVar13);
  in_RDI[9].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = psVar14;
  poses = (vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
          (long)*(int *)&in_RDI[2].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = poses;
  uVar13 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar23 = uVar13 + 8;
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar13) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar15 = (ulong *)operator_new__(uVar23);
  *puVar15 = (ulong)poses;
  psVar14 = (pointer)(puVar15 + 1);
  if (poses != (vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)0x0) {
    psVar21 = psVar14 + (long)poses * 3;
    in_stack_fffffffffffffed8 = psVar14;
    do {
      std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::vector
                ((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
                 0x16bb53);
      in_stack_fffffffffffffed8 = in_stack_fffffffffffffed8 + 3;
    } while (in_stack_fffffffffffffed8 != psVar21);
  }
  in_RDI[10].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_start = psVar14;
  std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::vector
            ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x16bb98);
  for (local_2c = 0;
      local_2c <
      *(int *)&in_RDI[2].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
               super__Vector_impl_data._M_start; local_2c = local_2c + 1) {
    sVar16 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::size
                       (local_10);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = sVar16;
    uVar13 = SUB168(auVar4 * ZEXT816(0x68),0);
    uVar23 = uVar13 + 8;
    if (0xfffffffffffffff7 < uVar13) {
      uVar23 = 0xffffffffffffffff;
    }
    if (SUB168(auVar4 * ZEXT816(0x68),8) != 0) {
      uVar23 = 0xffffffffffffffff;
    }
    psVar17 = (size_type *)operator_new__(uVar23);
    *psVar17 = sVar16;
    sVar22 = (sbpl_2Dcell_t)(psVar17 + 1);
    if (sVar16 != 0) {
      local_160 = sVar22;
      do {
        EnvNAVXYTHETALATAction_t::EnvNAVXYTHETALATAction_t(in_stack_fffffffffffffd80);
        local_160 = (sbpl_2Dcell_t)((long)local_160 + 0x68);
      } while (local_160 != (sbpl_2Dcell_t)((long)sVar22 + sVar16 * 0x68));
    }
    in_RDI[9].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[local_2c] = sVar22;
    sbpl_xy_theta_pt_t::sbpl_xy_theta_pt_t(&local_58);
    psVar21 = in_RDI[6].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_58.x = (double)psVar21 * 0.0 + (double)psVar21 * 0.5;
    psVar21 = in_RDI[6].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_58.y = (double)psVar21 * 0.0 + (double)psVar21 * 0.5;
    local_58.theta =
         (double)(*(code *)(in_RDI->
                           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>).
                           _M_impl.super__Vector_impl_data._M_start[0x20])(in_RDI,local_2c);
    for (local_60 = 0; uVar13 = local_60,
        sVar16 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::
                 size(local_10), uVar13 < sVar16; local_60 = local_60 + 1) {
      *(char *)((long)in_RDI[9].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[local_2c] + local_60 * 0x68)
           = (char)local_60;
      *(char *)((long)in_RDI[9].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[local_2c] + 1 +
               local_60 * 0x68) = (char)local_2c;
      pvVar18 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                            *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      pvVar19 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                            *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      sVar16 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size
                         (&pvVar19->intermptV);
      pvVar20 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::operator[]
                          (&pvVar18->intermptV,sVar16 - 1);
      local_68 = pvVar20->x;
      pvVar18 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                            *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      pvVar19 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                            *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      sVar16 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size
                         (&pvVar19->intermptV);
      pvVar20 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::operator[]
                          (&pvVar18->intermptV,sVar16 - 1);
      local_70 = pvVar20->y;
      pvVar18 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                            *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      pvVar19 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                            *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      sVar16 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size
                         (&pvVar19->intermptV);
      pvVar20 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::operator[]
                          (&pvVar18->intermptV,sVar16 - 1);
      dVar10 = local_58.x;
      dVar8 = local_68;
      local_78 = pvVar20->theta;
      dVar5 = cos(local_58.theta);
      dVar7 = local_70;
      dVar6 = sin(local_58.theta);
      dVar11 = local_58.y;
      dVar9 = local_68;
      local_80 = dVar10 + dVar8 * dVar5 + -(dVar7 * dVar6);
      dVar5 = sin(local_58.theta);
      dVar7 = local_70;
      dVar6 = cos(local_58.theta);
      local_88 = dVar11 + dVar9 * dVar5 + dVar7 * dVar6;
      if (local_80 < 0.0) {
        local_20c = (int)(local_80 /
                         (double)in_RDI[6].
                                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage) + -1;
      }
      else {
        local_20c = (int)(local_80 /
                         (double)in_RDI[6].
                                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      local_8c = local_20c;
      if (local_88 < 0.0) {
        local_210 = (int)(local_88 /
                         (double)in_RDI[6].
                                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage) + -1;
      }
      else {
        local_210 = (int)(local_88 /
                         (double)in_RDI[6].
                                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      local_90 = local_210;
      uVar12 = (*(code *)(in_RDI->super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>)
                         ._M_impl.super__Vector_impl_data._M_start[0x21])
                         (SUB84(local_78 + local_58.theta,0));
      *(undefined1 *)
       ((long)in_RDI[9].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[local_2c] + local_60 * 0x68 + 4) = uVar12;
      *(char *)((long)in_RDI[9].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[local_2c] + local_60 * 0x68
               + 2) = (char)local_8c;
      *(char *)((long)in_RDI[9].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[local_2c] + local_60 * 0x68
               + 3) = (char)local_90;
      if ((*(char *)((long)in_RDI[9].
                           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage[local_2c] + local_60 * 0x68 +
                    3) == '\0') &&
         (*(char *)((long)in_RDI[9].
                          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage[local_2c] + local_60 * 0x68 + 2)
          == '\0')) {
        in_stack_fffffffffffffdd0 =
             (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)
             ((double)in_RDI[6].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish * 1000.0);
        dVar5 = computeMinUnsignedAngleDiff
                          ((double)in_stack_fffffffffffffd80,(double)in_stack_fffffffffffffd78);
        *(int *)((long)in_RDI[9].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage[local_2c] + local_60 * 0x68
                + 8) = (int)(((double)in_stack_fffffffffffffdd0 * ABS(dVar5)) / 0.7853981633974483);
      }
      else {
        psVar21 = in_RDI[6].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        psVar1 = in_RDI[6].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl
                 .super__Vector_impl_data._M_start;
        dVar5 = sqrt((double)((int)*(char *)((long)in_RDI[9].
                                                                                                      
                                                  super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  [local_2c] + local_60 * 0x68 + 2) *
                              (int)*(char *)((long)in_RDI[9].
                                                                                                      
                                                  super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  [local_2c] + local_60 * 0x68 + 2) +
                             (int)*(char *)((long)in_RDI[9].
                                                  super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  [local_2c] + local_60 * 0x68 + 3) *
                             (int)*(char *)((long)in_RDI[9].
                                                  super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  [local_2c] + local_60 * 0x68 + 3)));
        dVar5 = ceil((((double)psVar21 * 1000.0) / (double)psVar1) * dVar5);
        *(int *)((long)in_RDI[9].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage[local_2c] + local_60 * 0x68
                + 8) = (int)dVar5;
      }
      std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::clear
                ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x16c471);
      std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::clear
                ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)0x16c4a2);
      std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::clear
                ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)0x16c4d3);
      sbpl_xy_theta_cell_t::sbpl_xy_theta_cell_t(&local_9c);
      local_9c.y = 0;
      local_9c.x = 0;
      local_9c.theta = 0;
      local_a0 = 0;
      while( true ) {
        pvVar18 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                            ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                              *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
        sVar16 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size
                           (&pvVar18->intermptV);
        if ((int)sVar16 <= local_a0) break;
        pvVar18 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                            ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                              *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
        pvVar20 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::operator[]
                            (&pvVar18->intermptV,(long)local_a0);
        dVar5 = pvVar20->theta;
        in_stack_fffffffffffffd90 =
             (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)pvVar20->x;
        in_stack_fffffffffffffd80 = (EnvNAVXYTHETALATAction_t *)pvVar20->y;
        __x = (value_type *)cos(local_58.theta);
        sin(local_58.theta);
        sin(local_58.theta);
        cos(local_58.theta);
        normalizeAngle(local_58.theta + dVar5);
        std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::push_back
                  ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
                   in_stack_fffffffffffffd90,__x);
        local_a0 = local_a0 + 1;
      }
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
                (in_stack_fffffffffffffdd0,
                 (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)pvVar18);
      std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::vector
                ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
                 in_stack_fffffffffffffdd0,
                 (vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)pvVar18);
      get_2d_motion_cells((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)psVar14,poses,in_RDI,
                          (double)in_stack_fffffffffffffed8);
      std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::~vector
                ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
                 in_stack_fffffffffffffd90);
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~vector
                ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffffd90);
      std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::
      push_back((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
                in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    }
  }
  sVar16 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::size
                     (local_10);
  *(int *)&in_RDI[10].super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
           super__Vector_impl_data._M_finish = (int)sVar16;
  (*(code *)(in_RDI->super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>)._M_impl.
            super__Vector_impl_data._M_start[0x4b])();
  std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~vector(in_stack_fffffffffffffd90);
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::PrecomputeActionswithBaseMotionPrimitive(
    std::vector<SBPL_xytheta_mprimitive>* motionprimitiveV)
{
    SBPL_PRINTF("Pre-computing action data using base motion primitives...\n");
    EnvNAVXYTHETALATCfg.ActionsV = new EnvNAVXYTHETALATAction_t*[EnvNAVXYTHETALATCfg.NumThetaDirs];
    EnvNAVXYTHETALATCfg.PredActionsV = new std::vector<EnvNAVXYTHETALATAction_t*> [EnvNAVXYTHETALATCfg.NumThetaDirs];
    std::vector<sbpl_2Dcell_t> footprint;

    //iterate over source angles
    for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
        SBPL_PRINTF("pre-computing for angle %d out of %d angles\n", tind, EnvNAVXYTHETALATCfg.NumThetaDirs);
        EnvNAVXYTHETALATCfg.ActionsV[tind] = new EnvNAVXYTHETALATAction_t[motionprimitiveV->size()];

        //compute sourcepose
        sbpl_xy_theta_pt_t sourcepose;
        sourcepose.x = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.y = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
    sourcepose.theta = DiscTheta2ContNew(tind);
    //sourcepose.theta = DiscTheta2Cont(tind, EnvNAVXYTHETALATCfg.NumThetaDirs);

        //iterate over motion primitives
        for (size_t aind = 0; aind < motionprimitiveV->size(); aind++) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
            double mp_endx_m = motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].x;
            double mp_endy_m = motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].y;
            double mp_endtheta_rad =
                    motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].theta;

            double endx = sourcepose.x + (mp_endx_m * cos(sourcepose.theta) - mp_endy_m * sin(sourcepose.theta));
            double endy = sourcepose.y + (mp_endx_m * sin(sourcepose.theta) + mp_endy_m * cos(sourcepose.theta));

            int endx_c = CONTXY2DISC(endx, EnvNAVXYTHETALATCfg.cellsize_m);
            int endy_c = CONTXY2DISC(endy, EnvNAVXYTHETALATCfg.cellsize_m);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = ContTheta2DiscNew(mp_endtheta_rad + sourcepose.theta);
        //EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = ContTheta2Disc(mp_endtheta_rad + sourcepose.theta, EnvNAVXYTHETALATCfg.NumThetaDirs);
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = endx_c;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = endy_c;

            if (EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY != 0 || EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX != 0)
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(ceil(NAVXYTHETALAT_COSTMULT_MTOMM
                    * EnvNAVXYTHETALATCfg.cellsize_m / EnvNAVXYTHETALATCfg.nominalvel_mpersecs
                    * sqrt((double)(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX
                        * EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX + EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY
                        * EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY))));
            else
                //cost of turn in place
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(NAVXYTHETALAT_COSTMULT_MTOMM
                    * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs
                    * fabs(computeMinUnsignedAngleDiff(mp_endtheta_rad, 0)) / (PI_CONST / 4.0));

            //compute and store interm points as well as intersecting cells
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].interm3DcellsV.clear();
            sbpl_xy_theta_cell_t previnterm3Dcell;
            previnterm3Dcell.theta = previnterm3Dcell.x = previnterm3Dcell.y = 0;

            for (int pind = 0; pind < (int)motionprimitiveV->at(aind).intermptV.size(); pind++) {
                sbpl_xy_theta_pt_t intermpt = motionprimitiveV->at(aind).intermptV[pind];

                //rotate it appropriately
                double rotx = intermpt.x * cos(sourcepose.theta) - intermpt.y * sin(sourcepose.theta);
                double roty = intermpt.x * sin(sourcepose.theta) + intermpt.y * cos(sourcepose.theta);
                intermpt.x = rotx;
                intermpt.y = roty;
                intermpt.theta = normalizeAngle(sourcepose.theta + intermpt.theta);

                //store it (they are with reference to 0,0,stattheta (not
                //sourcepose.x,sourcepose.y,starttheta (that is, half-bin))
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.push_back(intermpt);
            }
            //now compute the intersecting cells for this motion (including ignoring the source footprint)
            get_2d_motion_cells(EnvNAVXYTHETALATCfg.FootprintPolygon,
                                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV,
                                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                                EnvNAVXYTHETALATCfg.cellsize_m);

#if DEBUG
            SBPL_FPRINTF(fDeb,
                         "action tind=%d aind=%d: dX=%d dY=%d endtheta=%d (%.2f degs -> %.2f degs) "
                         "cost=%d (mprim: %.2f %.2f %.2f)\n",
                         tind,
                         (int)aind,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta,
                         sourcepose.theta * 180.0 / PI_CONST,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV[EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.size() - 1].theta * 180.0 / PI_CONST,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost,
                         mp_endx_m,
                         mp_endy_m,
                         mp_endtheta_rad);
#endif

            //add to the list of backward actions
            int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
            if (targettheta < 0) targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
            EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
        }
    }

    //set number of actions
    EnvNAVXYTHETALATCfg.actionwidth = motionprimitiveV->size();

    //now compute replanning data
    ComputeReplanningData();

    SBPL_PRINTF("done pre-computing action data based on motion primitives\n");
}